

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

CMFormat old_CMregister_format
                   (CManager cm,char *format_name,FMFieldList field_list,CMFormatList subformat_list
                   )

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  CMFormat p_Var4;
  FMFieldList in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int i;
  int sub_count;
  FMStructDescList structs;
  FMStructDescList in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  
  iVar5 = 0;
  if ((in_RCX != (FMFieldList)0x0) && (in_RCX->field_name != (char *)0x0)) {
    iVar5 = 1;
  }
  puVar3 = (undefined8 *)INT_CMmalloc(CONCAT44(iVar5,in_stack_ffffffffffffffd0));
  *puVar3 = in_RSI;
  puVar3[1] = in_RDX;
  iVar1 = struct_size_field_list(in_RCX,(int)((ulong)puVar3 >> 0x20));
  *(int *)(puVar3 + 2) = iVar1;
  puVar3[3] = 0;
  for (iVar1 = 0; iVar1 < iVar5; iVar1 = iVar1 + 1) {
    puVar3[(long)(iVar1 + 1) * 4] = (&in_RCX->field_name)[(long)iVar1 * 2];
    puVar3[(long)(iVar1 + 1) * 4 + 1] = (&in_RCX->field_type)[(long)iVar1 * 2];
    iVar2 = struct_size_field_list(in_RCX,(int)((ulong)puVar3 >> 0x20));
    *(int *)(puVar3 + (long)(iVar1 + 1) * 4 + 2) = iVar2;
    puVar3[(long)(iVar1 + 1) * 4 + 3] = 0;
  }
  puVar3[(long)(iVar5 + 1) * 4] = 0;
  puVar3[(long)(iVar5 + 1) * 4 + 1] = 0;
  p_Var4 = CMregister_format((CManager_conflict)CONCAT44(iVar5,iVar1),in_stack_ffffffffffffffc8);
  return p_Var4;
}

Assistant:

extern CMFormat
old_CMregister_format(CManager cm, char *format_name,
		      FMFieldList field_list, CMFormatList subformat_list)
{
    FMStructDescList structs;
    int sub_count = 0, i;
    if (subformat_list && (subformat_list[sub_count].format_name != NULL)) sub_count++;
    structs = malloc(sizeof(structs[0]) * (sub_count + 2));
    structs[0].format_name = format_name;
    structs[0].field_list = field_list;
    structs[0].struct_size = struct_size_field_list(field_list, (int)sizeof(char*));
    structs[0].opt_info = NULL;
    for (i = 0; i < sub_count; i++) {
	structs[i+1].format_name = subformat_list[i].format_name;
	structs[i+1].field_list = subformat_list[i].field_list;
	structs[i+1].struct_size = struct_size_field_list(structs[i+1].field_list, (int)sizeof(char*));
	structs[i+1].opt_info = NULL;
    }
    structs[sub_count+1].format_name = NULL;
    structs[sub_count+1].field_list = NULL;
    return CMregister_format(cm, structs);
}